

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<optTyped_valueConstructor1_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>_>
::CreateTest(TestFactoryImpl<optTyped_valueConstructor1_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>_>
             *this)

{
  Test *this_00;
  TestFactoryImpl<optTyped_valueConstructor1_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>_>
  *this_local;
  
  this_00 = (Test *)operator_new(0x28);
  optTyped_valueConstructor1_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>::
  optTyped_valueConstructor1_Test
            ((optTyped_valueConstructor1_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
              *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }